

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcPumpType::~IfcPumpType(IfcPumpType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)
   &this[-1].super_IfcFlowMovingDeviceType.super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x58 = 0x967730;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x40 = 0x967898;
  *(pointer *)
   ((long)&this[-1].super_IfcFlowMovingDeviceType.super_IfcDistributionFlowElementType.
           super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
           super_IfcTypeObject.HasPropertySets + 0x10) = (pointer)(vtable + 0x40);
  *(undefined8 *)
   &this[-1].super_IfcFlowMovingDeviceType.super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x967780;
  *(undefined8 *)
   &this[-1].super_IfcFlowMovingDeviceType.super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x9677a8;
  *(undefined8 *)
   &this[-1].super_IfcFlowMovingDeviceType.super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x9677d0;
  *(undefined8 *)&this[-1].field_0x1d8 = 0x9677f8;
  *(undefined8 *)&this[-1].field_0x1e8 = 0x967820;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x967848;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x10 = 0x967870;
  pvVar1 = *(void **)&(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
                      super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
                      super_IfcTypeObject.field_0x20;
  if ((undefined1 *)pvVar1 !=
      &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
       super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
       super_IfcTypeObject.field_0x30) {
    operator_delete(pvVar1);
  }
  this_00 = (IfcTypeProduct *)
            &this[-1].super_IfcFlowMovingDeviceType.super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject.field_0x58;
  *(undefined8 *)
   &this[-1].super_IfcFlowMovingDeviceType.super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x58 = 0x967ec0;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x40 = 0x967f88;
  *(pointer *)
   ((long)&this[-1].super_IfcFlowMovingDeviceType.super_IfcDistributionFlowElementType.
           super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
           super_IfcTypeObject.HasPropertySets + 0x10) =
       (pointer)(IfcElementType-in-Assimp::IFC::Schema_2x3::IfcPumpType::construction_vtable + 0x40)
  ;
  *(undefined8 *)
   &this[-1].super_IfcFlowMovingDeviceType.super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x967f10;
  *(undefined8 *)
   &this[-1].super_IfcFlowMovingDeviceType.super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x967f38;
  *(undefined8 *)
   &this[-1].super_IfcFlowMovingDeviceType.super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x967f60;
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcFlowMovingDeviceType.super_IfcDistributionFlowElementType.field_0x1b0
  ;
  if (puVar2 != &this[-1].super_IfcFlowMovingDeviceType.field_0x1c0) {
    operator_delete(puVar2);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__009678d0);
  operator_delete(this_00);
  return;
}

Assistant:

IfcPumpType() : Object("IfcPumpType") {}